

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_half(secp256k1_fe *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  
  secp256k1_fe_verify(r);
  secp256k1_fe_verify_magnitude(r,0x1f);
  uVar1 = -(ulong)((uint)r->n[0] & 1);
  uVar3 = uVar1 >> 0xc;
  uVar5 = (uVar3 & 0xffffefffffc2f) + r->n[0];
  if ((uVar5 & 1) == 0) {
    uVar2 = (uVar1 >> 0x10) + r->n[4];
    uVar4 = uVar3 + r->n[3];
    uVar7 = (uint)(uVar1 >> 0x2c);
    auVar6._0_8_ = CONCAT44(uVar7,(int)uVar3);
    auVar6._8_4_ = (int)uVar3;
    auVar6._12_4_ = uVar7;
    uVar1 = auVar6._0_8_ + r->n[1];
    uVar3 = auVar6._8_8_ + r->n[2];
    r->n[0] = ((ulong)((uint)uVar1 & 1) << 0x33) + (uVar5 >> 1);
    r->n[1] = ((uVar3 & 1) << 0x33) + (uVar1 >> 1);
    r->n[2] = ((uVar4 & 1) << 0x33) + (uVar3 >> 1);
    r->n[3] = ((ulong)((uint)uVar2 & 1) << 0x33) + (uVar4 >> 1);
    r->n[4] = uVar2 >> 1;
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/field_5x52_impl.h"
          ,0x17f,"test condition failed: (t0 & one) == 0");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_half(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY_MAGNITUDE(r, 31);

    secp256k1_fe_impl_half(r);
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}